

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O1

void __thiscall libtorrent::aux::socks5::connect2(socks5 *this,error_code *e)

{
  char cVar1;
  byte bVar2;
  transfer_all_t local_61;
  element_type *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_58;
  socket *local_50;
  _Bind<void_(libtorrent::aux::socks5::*(std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>))(const_boost::system::error_code_&)>
  local_48;
  mutable_buffer local_28;
  
  if (this->m_abort == false) {
    if (e->failed_ == true) {
      if (((this->m_alerts->m_alert_mask)._M_i.m_val & 1) != 0) {
        local_48._M_f = CONCAT71(local_48._M_f._1_7_,0x28);
        alert_manager::
        emplace_alert<libtorrent::socks5_alert,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>&,libtorrent::operation_t,boost::system::error_code_const&>
                  (this->m_alerts,&this->m_proxy_addr,(operation_t *)&local_48,e);
      }
      this->m_failures = this->m_failures + 1;
      retry_connection(this);
    }
    else if (((this->m_tmp_buf)._M_elems[0] == '\x05') && ((this->m_tmp_buf)._M_elems[1] == '\0')) {
      local_28.data_ = (this->m_tmp_buf)._M_elems + 1;
      cVar1 = (this->m_tmp_buf)._M_elems[3];
      if (cVar1 == '\x03') {
        bVar2 = (this->m_tmp_buf)._M_elems[4];
        (this->m_tmp_buf)._M_elems[0] = bVar2;
        local_28.size_ = (ulong)bVar2 + 2;
        ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::socks5,void>
                  ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                   (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
        local_48._M_f = (offset_in_socks5_to_subr)read_domainname;
        local_48._8_8_ = 0;
        local_48._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
        local_48._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_58;
        local_60 = (element_type *)0x0;
        p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50 = &this->m_socks5_sock;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
        ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
                      *)&local_50,&local_48,&local_28,&local_61);
      }
      else {
        if (cVar1 != '\x01') {
          return;
        }
        (this->m_tmp_buf)._M_elems[0] = (this->m_tmp_buf)._M_elems[4];
        local_28.size_ = 5;
        ::std::__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<libtorrent::aux::socks5,void>
                  ((__shared_ptr<libtorrent::aux::socks5,(__gnu_cxx::_Lock_policy)2> *)&local_60,
                   (__weak_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2> *)this);
        local_48._M_f = (offset_in_socks5_to_subr)read_bindaddr;
        local_48._8_8_ = 0;
        local_48._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_60;
        local_48._M_bound_args.
        super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
        super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
        super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             p_Stack_58;
        local_60 = (element_type *)0x0;
        p_Stack_58 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_50 = &this->m_socks5_sock;
        boost::asio::detail::
        initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
        ::operator()((initiate_async_read_buffer_sequence<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>
                      *)&local_50,&local_48,&local_28,&local_61);
      }
      if (local_48._M_bound_args.
          super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>.
          super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>._M_head_impl.
          super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48._M_bound_args.
                   super__Tuple_impl<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_std::_Placeholder<1>_>
                   .super__Head_base<0UL,_std::shared_ptr<libtorrent::aux::socks5>,_false>.
                   _M_head_impl.
                   super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (p_Stack_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_58);
      }
    }
  }
  return;
}

Assistant:

void socks5::connect2(error_code const& e)
{
	COMPLETE_ASYNC("socks5::connect2");

	if (m_abort) return;
	if (e)
	{
		if (m_alerts.should_post<socks5_alert>())
			m_alerts.emplace_alert<socks5_alert>(m_proxy_addr, operation_t::handshake, e);
		++m_failures;
		retry_connection();
		return;
	}

	using namespace libtorrent::aux;

	char* p = m_tmp_buf.data();
	int const version = read_uint8(p); // VERSION
	int const status = read_uint8(p); // STATUS
	++p; // RESERVED
	int const atyp = read_uint8(p); // address type

	if (version != 5 || status != 0) return;

	if (atyp == 1)
	{
		ADD_OUTSTANDING_ASYNC("socks5::read_bindaddr");
		// save the first byte of the IP address in the buffer. The
		// read_bindaddr() callback will use it
		m_tmp_buf[0] = *p;
		boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data() + 1, 5)
			, std::bind(&socks5::read_bindaddr, self(), _1));
	}
	else if (atyp == 3)
	{
		// we need to skip DOMAINNAME to imitate Python socks client
		std::size_t const len = read_uint8(p);
		ADD_OUTSTANDING_ASYNC("socks5::read_domainname");
		// save the string length in the buffer. The read_domainname() callback
		// will use it
		m_tmp_buf[0] = char(len);
		boost::asio::async_read(m_socks5_sock, boost::asio::buffer(m_tmp_buf.data()+1, len + 2)
			, std::bind(&socks5::read_domainname, self(), _1));
	}
	else
	{
		// in this case we need to read more data from the socket
		// no IPv6 support for UDP socks5
		TORRENT_ASSERT_FAIL();
		return;
	}
}